

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O3

Object * getPureObject(Object *object)

{
  int iVar1;
  long lVar2;
  runtime_error *this;
  
  if (object != (Object *)0x0) {
    iVar1 = (**object->_vptr_Object)();
    if ((char)iVar1 == '\x02') {
      lVar2 = __dynamic_cast(object,&Object::typeinfo,&Variable::typeinfo,0);
      object = *(Object **)(lVar2 + 8);
    }
    return object;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"ScriptUtils::getPureObject => object is null!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object* getPureObject(Object* object) {
	if (object == nullptr) {
		throw std::runtime_error("ScriptUtils::getPureObject => object is null!");
	}
	ObjectType type = object->getType();
	if (type == OT_VARIABLE) {
		auto *objectVariable = dynamic_cast<Variable *>(object);
		return objectVariable->value;
	} else {
		return object;
	}
}